

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O0

void __thiscall
dlib::bn_<(dlib::layer_mode)0>::
backward<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::con_<512l,3l,3l,1,1,1,1>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<512l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,void>,true,void>>
          (bn_<(dlib::layer_mode)0> *this,tensor *gradient_input,
          subnet_wrapper<dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
          *sub,tensor *params_grad)

{
  tensor *gamma_grad;
  double eps;
  tensor *src;
  tensor *in_RCX;
  tensor *gradient_input_00;
  tensor *in_RSI;
  long in_RDI;
  alias_tensor_instance b_grad;
  alias_tensor_instance g_grad;
  alias_tensor_instance g;
  tensor *in_stack_fffffffffffffe98;
  tensor *invstds;
  tensor local_108 [4];
  tensor *local_20;
  tensor *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  alias_tensor::operator()
            ((alias_tensor *)g.super_tensor.m_n,(tensor *)g.super_tensor._vptr_tensor,
             g_grad.data_offset);
  alias_tensor::operator()
            ((alias_tensor *)g.super_tensor.m_n,(tensor *)g.super_tensor._vptr_tensor,
             g_grad.data_offset);
  gamma_grad = (tensor *)(in_RDI + 0xe0);
  alias_tensor::size((alias_tensor *)(in_RDI + 0x98));
  alias_tensor::operator()
            ((alias_tensor *)g.super_tensor.m_n,(tensor *)g.super_tensor._vptr_tensor,
             g_grad.data_offset);
  invstds = *(tensor **)(in_RDI + 0x3b8);
  gradient_input_00 = (tensor *)(in_RDI + 0x128);
  eps = (double)(in_RDI + 600);
  dimpl::
  subnet_wrapper<dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
  ::get_output((subnet_wrapper<dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
                *)0x1fbd46);
  src = dimpl::
        subnet_wrapper<dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
        ::get_gradient_input
                  ((subnet_wrapper<dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_true,_void>
                    *)0x1fbd5a);
  tt::batch_normalize_conv_gradient
            (eps,gradient_input_00,local_10,invstds,src,in_stack_fffffffffffffe98,local_108,
             gamma_grad,local_20);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1fbdb0);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1fbdbd);
  alias_tensor_instance::~alias_tensor_instance((alias_tensor_instance *)0x1fbdca);
  return;
}

Assistant:

void backward(const tensor& gradient_input, SUBNET& sub, tensor& params_grad)
        {
            auto g = gamma(params,0);
            auto g_grad = gamma(params_grad, 0);
            auto b_grad = beta(params_grad, gamma.size());
            if (mode == FC_MODE)
                tt::batch_normalize_gradient(eps, gradient_input, means, invstds, sub.get_output(), g, sub.get_gradient_input(), g_grad, b_grad );
            else
                tt::batch_normalize_conv_gradient(eps, gradient_input, means, invstds, sub.get_output(), g, sub.get_gradient_input(), g_grad, b_grad );
        }